

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O3

ze_result_t
zeInitDrivers(uint32_t *pCount,ze_driver_handle_t *phDrivers,ze_init_driver_type_desc_t *desc)

{
  code *pcVar1;
  int iVar2;
  ze_result_t zVar3;
  long *plVar4;
  undefined8 *puVar5;
  pthread_once_t *__once_control;
  ze_result_t local_4c;
  ze_init_driver_type_desc_t **local_48;
  ze_init_driver_type_desc_t *local_40;
  ze_result_t *local_38;
  
  local_38 = &local_4c;
  local_4c = ZE_RESULT_SUCCESS;
  __once_control = (pthread_once_t *)(ze_lib::context + 4);
  local_48 = &local_40;
  local_40 = desc;
  plVar4 = (long *)__tls_get_addr(&PTR_001f3c58);
  *plVar4 = (long)&local_48;
  puVar5 = (undefined8 *)__tls_get_addr(&PTR_001f3d80);
  *puVar5 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  iVar2 = pthread_once(__once_control,__once_proxy);
  if (iVar2 == 0) {
    *plVar4 = 0;
    *puVar5 = 0;
    zVar3 = local_4c;
    if ((local_4c == ZE_RESULT_SUCCESS) &&
       (zVar3 = ZE_RESULT_ERROR_UNINITIALIZED, ze_lib::destruction == '\0')) {
      pcVar1 = *(code **)(*(long *)(ze_lib::context + 0x10) + 0x90);
      if (pcVar1 == (code *)0x0) {
        zVar3 = (uint)*(byte *)(ze_lib::context + 0xd90) * 2 + ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        zVar3 = (*pcVar1)(pCount,phDrivers,desc);
        if ((phDrivers != (ze_driver_handle_t *)0x0) && (zVar3 == ZE_RESULT_SUCCESS)) {
          *(undefined1 *)(ze_lib::context + 0xd92) = 1;
          zVar3 = ZE_RESULT_SUCCESS;
        }
      }
    }
    return zVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ze_result_t ZE_APICALL
zeInitDrivers(
    uint32_t* pCount,                               ///< [in,out] pointer to the number of driver instances.
                                                    ///< if count is zero, then the loader shall update the value with the
                                                    ///< total number of drivers available.
                                                    ///< if count is greater than the number of drivers available, then the
                                                    ///< loader shall update the value with the correct number of drivers available.
    ze_driver_handle_t* phDrivers,                  ///< [in,out][optional][range(0, *pCount)] array of driver instance handles.
                                                    ///< if count is less than the number of drivers available, then the loader
                                                    ///< shall only retrieve that number of drivers.
    ze_init_driver_type_desc_t* desc                ///< [in] descriptor containing the driver type initialization details
                                                    ///< including ::ze_init_driver_type_flag_t combinations.
    )
{
    ze_result_t result = ZE_RESULT_SUCCESS;
    #ifdef DYNAMIC_LOAD_LOADER
    if (!ze_lib::context) {
        ze_lib::context = new ze_lib::context_t;
    }
    #endif
    std::call_once(ze_lib::context->initOnceDrivers, [desc,&result]() {
        result = ze_lib::context->Init(0, false, desc);
        return result;
    });

    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }

    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnInitDrivers = ze_lib::context->zeDdiTable.load()->Global.pfnInitDrivers;
    if( nullptr == pfnInitDrivers ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    result = pfnInitDrivers( pCount, phDrivers, desc );

    if (result == ZE_RESULT_SUCCESS) {
        if (phDrivers) {
            ze_lib::context->zeInuse = true;
        }
    }

    return result;
}